

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O0

vm_obj_id_t __thiscall
TadsHttpReqResult::prep_event_obj(TadsHttpReqResult *this,int *argc,int *evt_type)

{
  long *plVar1;
  int iVar2;
  TadsHttpReqResult *this_00;
  CVmDataSource *fp;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  bool bVar3;
  vm_obj_id_t fileobj;
  vm_obj_id_t csobj;
  char *ct;
  size_t cslen;
  char *charset;
  int mode;
  vm_obj_id_t in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff94;
  byte in_stack_ffffffffffffff95;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  char *in_stack_ffffffffffffff98;
  CVmRun *in_stack_ffffffffffffffa0;
  CVmRun *this_01;
  vm_obj_id_t charset_00;
  int in_stack_ffffffffffffffc0;
  long *local_38;
  int local_1c;
  
  if (*(long *)(in_RDI + 0x60) == 0) {
    this_00 = (TadsHttpReqResult *)0x0;
  }
  else {
    this_00 = (TadsHttpReqResult *)strlen(*(char **)(in_RDI + 0x60));
  }
  CVmRun::push_string(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                      CONCAT17(in_stack_ffffffffffffff97,
                               CONCAT16(in_stack_ffffffffffffff96,
                                        CONCAT15(in_stack_ffffffffffffff95,
                                                 CONCAT14(in_stack_ffffffffffffff94,
                                                          in_stack_ffffffffffffff90)))));
  this_01 = *(CVmRun **)(in_RDI + 0x58);
  if (*(long *)(in_RDI + 0x58) == 0) {
    fp = (CVmDataSource *)0x0;
  }
  else {
    fp = (CVmDataSource *)strlen(*(char **)(in_RDI + 0x58));
  }
  CVmRun::push_string(this_01,(char *)fp,
                      CONCAT17(in_stack_ffffffffffffff97,
                               CONCAT16(in_stack_ffffffffffffff96,
                                        CONCAT15(in_stack_ffffffffffffff95,
                                                 CONCAT14(in_stack_ffffffffffffff94,
                                                          in_stack_ffffffffffffff90)))));
  if (*(long *)(in_RDI + 0x50) == 0) {
    CVmRun::push_nil((CVmRun *)0x253e66);
  }
  else {
    local_1c = 3;
    local_38 = (long *)find_header(this_00,(char *)this_01);
    charset_00 = (vm_obj_id_t)((ulong)this_01 >> 0x20);
    if (local_38 != (long *)0x0) {
      iVar2 = memcmp(local_38,"text/",5);
      charset_00 = (vm_obj_id_t)((ulong)this_01 >> 0x20);
      if (iVar2 == 0) {
        local_1c = 1;
        while( true ) {
          charset_00 = (vm_obj_id_t)((ulong)this_01 >> 0x20);
          while( true ) {
            bVar3 = false;
            if ((((char)*local_38 != '\0') && (bVar3 = false, (char)*local_38 != '\r')) &&
               (bVar3 = false, (char)*local_38 != '\n')) {
              bVar3 = (char)*local_38 != ';';
            }
            if (!bVar3) break;
            local_38 = (long *)((long)local_38 + 1);
          }
          in_stack_ffffffffffffff97 = 0;
          if ((char)*local_38 != ';') goto LAB_00253dd4;
          do {
            plVar1 = local_38;
            local_38 = (long *)((long)plVar1 + 1);
            bVar3 = false;
            if (*(char *)local_38 != '\0') {
              iVar2 = is_space(L'\0');
              bVar3 = iVar2 != 0;
            }
          } while (bVar3);
          if (*local_38 == 0x3d74657372616863) break;
          in_stack_ffffffffffffff96 = 0;
        }
        local_38 = (long *)((long)plVar1 + 9);
        in_stack_ffffffffffffff96 = 0;
        while( true ) {
          in_stack_ffffffffffffff95 = 0;
          if ((((char)*local_38 != '\r') && (in_stack_ffffffffffffff95 = 0, (char)*local_38 != '\n')
              ) && (in_stack_ffffffffffffff95 = 0, (char)*local_38 != ';')) {
            iVar2 = is_space(L'\0');
            in_stack_ffffffffffffff95 = iVar2 != 0 ^ 0xff;
          }
          charset_00 = (vm_obj_id_t)((ulong)this_01 >> 0x20);
          if ((in_stack_ffffffffffffff95 & 1) == 0) break;
          local_38 = (long *)((long)local_38 + 1);
        }
      }
    }
LAB_00253dd4:
    if (local_1c == 1) {
      CVmObjCharSet::create
                (charset_00,(char *)fp,
                 CONCAT17(in_stack_ffffffffffffff97,
                          CONCAT16(in_stack_ffffffffffffff96,
                                   CONCAT15(in_stack_ffffffffffffff95,
                                            CONCAT14(in_stack_ffffffffffffff94,
                                                     in_stack_ffffffffffffff90)))));
    }
    (**(code **)(**(long **)(in_RDI + 0x50) + 0x40))(*(long **)(in_RDI + 0x50),0,0);
    CVmObjFile::create((int)((ulong)in_RDI >> 0x20),(CVmNetFile *)this_00,charset_00,fp,
                       CONCAT13(in_stack_ffffffffffffff97,
                                CONCAT12(in_stack_ffffffffffffff96,
                                         CONCAT11(in_stack_ffffffffffffff95,
                                                  in_stack_ffffffffffffff94))),
                       in_stack_ffffffffffffff90,in_stack_ffffffffffffffc0);
    CVmRun::push_obj((CVmRun *)
                     CONCAT17(in_stack_ffffffffffffff97,
                              CONCAT16(in_stack_ffffffffffffff96,
                                       CONCAT15(in_stack_ffffffffffffff95,
                                                CONCAT14(in_stack_ffffffffffffff94,
                                                         in_stack_ffffffffffffff90)))),
                     in_stack_ffffffffffffff8c);
    *(undefined8 *)(in_RDI + 0x50) = 0;
  }
  CVmRun::push_int((CVmRun *)
                   CONCAT17(in_stack_ffffffffffffff97,
                            CONCAT16(in_stack_ffffffffffffff96,
                                     CONCAT15(in_stack_ffffffffffffff95,
                                              CONCAT14(in_stack_ffffffffffffff94,
                                                       in_stack_ffffffffffffff90)))),
                   in_stack_ffffffffffffff8c);
  CVmStack::push(*(vm_val_t **)(in_RDI + 0x40));
  *in_RSI = 5;
  *in_RDX = 5;
  return G_predef_X.net_reply_event;
}

Assistant:

virtual vm_obj_id_t prep_event_obj(VMG_ int *argc, int *evt_type)
    {
        /* push the location string (or nil) */
        G_interpreter->push_string(vmg_ loc, loc != 0 ? strlen(loc) : 0);

        /* push the header string (or nil) */
        G_interpreter->push_string(vmg_ hdrs, hdrs != 0 ? strlen(hdrs) : 0);

        /* if we have reply data, push it as a File object */
        if (reply != 0)
        {
            /*
             *   Look for a content-type header, to determine the format of
             *   the reply body.  If the header starts with "text/", it's a
             *   text type; otherwise it's a binary type.
             */
            int mode = VMOBJFILE_MODE_RAW;
            const char *charset = "ISO-8859-1";
            size_t cslen = 10;
            const char *ct = find_header("content-type");
            if (ct != 0 && memcmp(ct, "text/", 5) == 0)
            {
                /* it's a textual type */
                mode = VMOBJFILE_MODE_TEXT;

                /* look for a 'charset' attribute */
                for (;;)
                {
                    /* scan ahead to the next ';' before end of line */
                    for ( ; *ct != '\0' && *ct != '\r'
                            && *ct != '\n' && *ct != ';' ; ++ct) ;
                    if (*ct != ';')
                        break;

                    /* skip the ';' and spaces */
                    for (ct += 1 ; *ct != '\0' && is_space(*ct) ; ++ct) ;

                    /* check for "charset" */
                    if (memcmp(ct, "charset=", 8) == 0)
                    {
                        /* note the "charset" attribute, and find the end */
                        for (ct += 8, charset = ct ;
                             *ct != '\r' && *ct != '\n' && *ct != ';'
                                 && !is_space(*ct) ; ++ct) ;

                        /* note the character set name length */
                        cslen = ct - charset;

                        /* look no further */
                        break;
                    }
                }
            }

            /* if it's a text-mode file, create a character mapper */
            vm_obj_id_t csobj = VM_INVALID_OBJ;
            if (mode == VMOBJFILE_MODE_TEXT)
                csobj = CVmObjCharSet::create(vmg_ FALSE, charset, cslen);

            /* seek to the beginning of the reply stream */
            reply->seek(0, OSFSK_SET);

            /* create a File object from the Data Source */
            vm_obj_id_t fileobj = CVmObjFile::create(
                vmg_ FALSE, 0, csobj, reply, mode,
                VMOBJFILE_ACCESS_READ, TRUE);
            
            /* push the file object */
            G_interpreter->push_obj(vmg_ fileobj);

            /* 
             *   the File object owns the data source, which owns the reply
             *   stream, so forget about the reply stream
             */
            reply = 0;
        }
        else
        {
            /* no reply data - push nil */
            G_interpreter->push_nil(vmg0_);
        }

        /* push the network status code */
        G_interpreter->push_int(vmg_ status);

        /* push the caller's ID value */
        G_stk->push(&idg->val);

        /* relay our added argument count to the caller */
        *argc = 5;

        /* set the event type to NetEvReply (5 - see include/tadsnet.h) */
        *evt_type = 5;

        /* the event subclass is NetReplyEvent */
        return G_predef->net_reply_event;
    }